

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int disposition_get_state(DISPOSITION_HANDLE disposition,AMQP_VALUE *state_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint local_1c;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    iVar3 = 0x22d1;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(disposition->composite_value,&local_1c);
    iVar3 = 0x22d9;
    if ((iVar1 == 0) && (iVar3 = 0x22df, 4 < local_1c)) {
      value = amqpvalue_get_composite_item_in_place(disposition->composite_value,4);
      iVar3 = 0x22e7;
      if (value != (AMQP_VALUE)0x0) {
        AVar2 = amqpvalue_get_type(value);
        if (AVar2 != AMQP_TYPE_NULL) {
          *state_value = value;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int disposition_get_state(DISPOSITION_HANDLE disposition, AMQP_VALUE* state_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        if (amqpvalue_get_composite_item_count(disposition_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 4)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(disposition_instance->composite_value, 4);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *state_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}